

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock.c
# Opt level: O0

void mmk_mock_destroy_internal(mmk_mock_ctx *mock)

{
  mmk_stub *pmVar1;
  mmk_params *pmVar2;
  mmk_matcher *pmVar3;
  mmk_matcher *next_1;
  mmk_matcher *m;
  mmk_params *pnext;
  mmk_params *p;
  mmk_stub *next;
  mmk_stub *s;
  mmk_mock_ctx *mock_local;
  
  next = mock->stubs;
  while (next != (mmk_stub *)0x0) {
    pmVar1 = next->next;
    mmk_stub_destroy(next);
    next = pmVar1;
  }
  mmk_free(mock->call_data);
  pnext = mock->params;
  while (pnext != (mmk_params *)0x0) {
    pmVar2 = pnext->next;
    next_1 = pnext->matcher_ctx;
    while (next_1 != (mmk_matcher *)0x0) {
      pmVar3 = next_1->next;
      mmk_free(next_1);
      next_1 = pmVar3;
    }
    mmk_free(pnext);
    pnext = pmVar2;
  }
  mmk_free(mock);
  return;
}

Assistant:

void mmk_mock_destroy_internal(struct mmk_mock_ctx *mock)
{
    for (struct mmk_stub *s = mock->stubs; s;) {
        struct mmk_stub *next = s->next;
        mmk_stub_destroy(s);
        s = next;
    }
    mmk_free(mock->call_data);
    for (struct mmk_params *p = mock->params, *pnext; p;) {
        pnext = p->next;
        for (struct mmk_matcher *m = p->matcher_ctx, *next; m;) {
            next = m->next;
            mmk_free(m);
            m = next;
        }
        mmk_free(p);
        p = pnext;
    }
    mmk_free(mock);
}